

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

int32 __thiscall osc::ReceivedMessageArgument::AsInt32Unchecked(ReceivedMessageArgument *this)

{
  undefined4 local_14;
  anon_union_4_2_94730047 u;
  ReceivedMessageArgument *this_local;
  
  local_14 = CONCAT13(*this->argumentPtr_,
                      CONCAT12(this->argumentPtr_[1],
                               CONCAT11(this->argumentPtr_[2],this->argumentPtr_[3])));
  return local_14;
}

Assistant:

int32 ReceivedMessageArgument::AsInt32Unchecked() const
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        osc::int32 i;
        char c[4];
    } u;

    u.c[0] = argumentPtr_[3];
    u.c[1] = argumentPtr_[2];
    u.c[2] = argumentPtr_[1];
    u.c[3] = argumentPtr_[0];

    return u.i;
#else
	return *(int32*)argument_;
#endif
}